

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

region * create_gas_cloud(level *lev,xchar x,xchar y,int radius,int damage,int duration)

{
  short sVar1;
  nhrect *__src;
  char cVar2;
  int iVar3;
  region *reg;
  nhrect *__dest;
  byte bVar4;
  long lVar5;
  byte bVar6;
  
  reg = (region *)malloc(0x58);
  (reg->bounding_box).lx = '\0';
  (reg->bounding_box).ly = '\0';
  (reg->bounding_box).hx = '\0';
  (reg->bounding_box).hy = '\0';
  reg->nrects = 0;
  reg->attach_2_u = '\0';
  reg->field_0x17 = 0;
  *(undefined8 *)&reg->attach_2_m = 0;
  reg->lev = (level *)0x0;
  reg->rects = (nhrect *)0x0;
  reg->ttl = 0;
  reg->expire_f = 0;
  reg->can_enter_f = 0;
  reg->enter_f = 0;
  reg->can_leave_f = 0;
  reg->leave_f = 0;
  reg->inside_f = 0;
  reg->player_flags = '\0';
  reg->field_0x3f = 0;
  reg->enter_msg = (char *)0x0;
  reg->leave_msg = (char *)0x0;
  reg->monsters = (uint *)0x0;
  reg->n_monst = 0;
  reg->max_monst = 0;
  reg->visible = '\0';
  *(undefined3 *)&reg->field_0x4d = 0;
  reg->effect_id = 0;
  reg->arg = 0;
  (reg->bounding_box).lx = 'c';
  (reg->bounding_box).ly = 'c';
  (reg->bounding_box).hx = '\0';
  (reg->bounding_box).hy = '\0';
  reg->nrects = 0;
  reg->rects = (nhrect *)0x0;
  reg->enter_f = -1;
  reg->can_leave_f = -1;
  reg->leave_f = -1;
  reg->inside_f = -1;
  reg->ttl = -1;
  reg->expire_f = -1;
  reg->can_enter_f = -1;
  reg->enter_f = -1;
  reg->player_flags = reg->player_flags & 0xfcU | 2;
  if (0 < radius) {
    bVar6 = y - (char)radius;
    bVar4 = x;
    do {
      bVar6 = bVar6 + 1;
      lVar5 = (long)reg->nrects;
      __dest = (nhrect *)malloc(lVar5 * 4 + 4);
      if (0 < lVar5) {
        __src = reg->rects;
        memcpy(__dest,__src,lVar5 << 2);
        free(__src);
      }
      iVar3 = (uint)(byte)(y - 1) + radius;
      sVar1 = reg->nrects;
      __dest[sVar1] =
           (nhrect)((uint)bVar6 << 8 | (uint)(byte)x << 0x10 | iVar3 * 0x1000000 | (uint)bVar4);
      reg->nrects = sVar1 + 1;
      reg->rects = __dest;
      if ((char)bVar4 < (reg->bounding_box).lx) {
        (reg->bounding_box).lx = bVar4;
      }
      if ((char)bVar6 < (reg->bounding_box).ly) {
        (reg->bounding_box).ly = bVar6;
      }
      if ((reg->bounding_box).hx < x) {
        (reg->bounding_box).hx = x;
      }
      cVar2 = (char)iVar3;
      if ((reg->bounding_box).hy < cVar2) {
        (reg->bounding_box).hy = cVar2;
      }
      bVar4 = bVar4 - 1;
      x = x + 1;
      radius = radius + -1;
    } while (radius != 0);
  }
  reg->ttl = (short)duration;
  if (flags.mon_moving == '\0' && in_mklev == '\0') {
    reg->player_flags = reg->player_flags & 0xfd;
  }
  reg->inside_f = 0;
  reg->expire_f = 1;
  reg->arg = damage;
  reg->visible = '\x01';
  reg->effect_id = 0x40009;
  add_region(lev,reg);
  return reg;
}

Assistant:

struct region *create_gas_cloud(struct level *lev, xchar x, xchar y,
				int radius, int damage, int duration)
{
    struct region *cloud;
    int i, nrect;
    struct nhrect tmprect;

    cloud = create_region(NULL, 0);
    nrect = radius;
    tmprect.lx = x;
    tmprect.hx = x;
    tmprect.ly = y - (radius - 1);
    tmprect.hy = y + (radius - 1);
    for (i = 0; i < nrect; i++) {
	add_rect_to_reg(cloud, &tmprect);
	tmprect.lx--;
	tmprect.hx++;
	tmprect.ly++;
	tmprect.hy--;
    }
    cloud->ttl = duration;
    if (!in_mklev && !flags.mon_moving)
	set_heros_fault(cloud);		/* assume player has created it */
    cloud->inside_f = INSIDE_GAS_CLOUD;
    cloud->expire_f = EXPIRE_GAS_CLOUD;
    cloud->arg = damage;
    cloud->visible = TRUE;
    cloud->effect_id = dbuf_effect(E_MISC, E_gascloud);
    add_region(lev, cloud);
    return cloud;
}